

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::Image::GLES2ImageApi::ModifyRenderbufferClearColor::initializeRbo
          (ModifyRenderbufferClearColor *this,GLES2ImageApi *api,GLuint renderbuffer,
          Texture2D *reference)

{
  Functions *gl;
  GLenum GVar1;
  
  gl = api->m_gl;
  framebufferRenderbuffer(gl,0x8ce0,renderbuffer);
  (*gl->viewport)(0,0,reference->m_width,reference->m_height);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"viewport(0, 0, reference.getWidth(), reference.getHeight())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x339);
  (*gl->clearColor)((this->m_color).m_data[0],(this->m_color).m_data[1],(this->m_color).m_data[2],
                    (this->m_color).m_data[3]);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"clearColor(m_color.x(), m_color.y(), m_color.z(), m_color.w())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x33a);
  (*gl->clear)(0x4000);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"clear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x33b);
  tcu::clear((reference->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&this->m_color);
  return;
}

Assistant:

void GLES2ImageApi::ModifyRenderbufferClearColor::initializeRbo (GLES2ImageApi& api, GLuint renderbuffer, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl		= api.m_gl;

	framebufferRenderbuffer(gl, GL_COLOR_ATTACHMENT0, renderbuffer);

	GLU_CHECK_GLW_CALL(gl, viewport(0, 0, reference.getWidth(), reference.getHeight()));
	GLU_CHECK_GLW_CALL(gl, clearColor(m_color.x(), m_color.y(), m_color.z(), m_color.w()));
	GLU_CHECK_GLW_CALL(gl, clear(GL_COLOR_BUFFER_BIT));

	tcu::clear(reference.getLevel(0), m_color);
}